

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::SplitQueryStringIntoStatements
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,string *query)

{
  reference pvVar1;
  reference pvVar2;
  idx_t iVar3;
  ulong __n;
  vector<duckdb::SimplifiedToken,_true> tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Parser::Tokenize(&tokens,query);
  for (__n = 1; __n < (ulong)((long)tokens.
                                    super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                                    .
                                    super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)tokens.
                                    super_vector<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                                    .
                                    super__Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    pvVar1 = vector<duckdb::SimplifiedToken,_true>::get<true>(&tokens,__n - 1);
    pvVar2 = vector<duckdb::SimplifiedToken,_true>::get<true>(&tokens,__n);
    if (pvVar1->type == SIMPLIFIED_TOKEN_OPERATOR) {
      for (iVar3 = pvVar1->start; iVar3 <= pvVar2->start; iVar3 = iVar3 + 1) {
        if ((query->_M_dataplus)._M_p[iVar3] == ';') {
          ::std::__cxx11::string::substr((ulong)&local_50,(ulong)query);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          vector<duckdb::SimplifiedToken,_true>::get<true>(&tokens,__n);
        }
      }
    }
  }
  ::std::__cxx11::string::substr((ulong)&local_50,(ulong)query);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::_Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_>::
  ~_Vector_base((_Vector_base<duckdb::SimplifiedToken,_std::allocator<duckdb::SimplifiedToken>_> *)
                &tokens);
  return __return_storage_ptr__;
}

Assistant:

vector<string> SplitQueryStringIntoStatements(const string &query) {
	// Break sql string down into sql statements using the tokenizer
	vector<string> query_statements;
	auto tokens = Parser::Tokenize(query);
	idx_t next_statement_start = 0;
	for (idx_t i = 1; i < tokens.size(); ++i) {
		auto &t_prev = tokens[i - 1];
		auto &t = tokens[i];
		if (t_prev.type == SimplifiedTokenType::SIMPLIFIED_TOKEN_OPERATOR) {
			// LCOV_EXCL_START
			for (idx_t c = t_prev.start; c <= t.start; ++c) {
				if (query.c_str()[c] == ';') {
					query_statements.emplace_back(query.substr(next_statement_start, t.start - next_statement_start));
					next_statement_start = tokens[i].start;
				}
			}
			// LCOV_EXCL_STOP
		}
	}
	query_statements.emplace_back(query.substr(next_statement_start, query.size() - next_statement_start));
	return query_statements;
}